

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O3

e_int16 OPLL_calc(OPLL *opll)

{
  e_int16 eVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  if (opll->quality == 0) {
    eVar1 = calc(opll);
    return eVar1;
  }
  uVar5 = opll->realstep;
  uVar3 = opll->oplltime;
  if (uVar3 < uVar5) {
    iVar4 = opll->next;
    do {
      opll->oplltime = uVar3 + opll->opllstep;
      opll->prev = iVar4;
      eVar1 = calc(opll);
      iVar4 = (int)eVar1;
      opll->next = iVar4;
      uVar5 = opll->realstep;
      uVar3 = opll->oplltime;
    } while (uVar3 < uVar5);
  }
  else {
    iVar4 = opll->next;
  }
  uVar3 = uVar3 - uVar5;
  opll->oplltime = uVar3;
  sVar2 = (short)(int)(((double)uVar3 * (double)opll->prev +
                       (double)(opll->opllstep - uVar3) * (double)iVar4) / (double)opll->opllstep);
  opll->out = (int)sVar2;
  return sVar2;
}

Assistant:

e_int16
OPLL_calc (OPLL * opll)
{
  if (!opll->quality)
    return calc (opll);

  while (opll->realstep > opll->oplltime)
  {
    opll->oplltime += opll->opllstep;
    opll->prev = opll->next;
    opll->next = calc (opll);
  }

  opll->oplltime -= opll->realstep;
  opll->out = (e_int16) (((double) opll->next * (opll->opllstep - opll->oplltime)
                          + (double) opll->prev * opll->oplltime) / opll->opllstep);

  return (e_int16) opll->out;
}